

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallFinalizableHeapBucket.cpp
# Opt level: O2

void __thiscall
Memory::
SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
::FinalizeAllObjects
          (SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
           *this)

{
  HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>::
  ClearAllocators((HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                   *)this);
  HeapBlockList::
  ForEach<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>,Memory::SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>::FinalizeHeapBlockList(Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>*)::_lambda(Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>*)_1_>
            (this->pendingDisposeList);
  HeapBlockList::
  ForEach<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>,Memory::SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>::FinalizeHeapBlockList(Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>*)::_lambda(Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>*)_1_>
            ((this->
             super_SmallNormalHeapBucketBase<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
             ).partialHeapBlockList);
  HeapBlockList::
  ForEach<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>,Memory::SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>::FinalizeHeapBlockList(Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>*)::_lambda(Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>*)_1_>
            ((this->
             super_SmallNormalHeapBucketBase<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
             ).
             super_HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
             .heapBlockList);
  HeapBlockList::
  ForEach<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>,Memory::SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>::FinalizeHeapBlockList(Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>*)::_lambda(Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>*)_1_>
            ((this->
             super_SmallNormalHeapBucketBase<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
             ).
             super_HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
             .fullBlockList);
  HeapBlockList::
  ForEach<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>,Memory::SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>::FinalizeHeapBlockList(Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>*)::_lambda(Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>*)_1_>
            ((this->
             super_SmallNormalHeapBucketBase<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
             ).partialSweptHeapBlockList);
  return;
}

Assistant:

void
SmallFinalizableHeapBucketBaseT<TBlockType>::FinalizeAllObjects()
{
    // Finalize all objects on shutdown.

    // Clear allocators to update the information on the heapblock
    // Walk through the allocated object and call finalize and dispose on them
    this->ClearAllocators();
    FinalizeHeapBlockList(this->pendingDisposeList);
#if ENABLE_PARTIAL_GC
    FinalizeHeapBlockList(this->partialHeapBlockList);
#endif
    FinalizeHeapBlockList(this->heapBlockList);
    FinalizeHeapBlockList(this->fullBlockList);

#if ENABLE_PARTIAL_GC && ENABLE_CONCURRENT_GC
    FinalizeHeapBlockList(this->partialSweptHeapBlockList);
#endif
}